

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# XPathMatcherStack.cpp
# Opt level: O2

void __thiscall
xercesc_4_0::XPathMatcherStack::XPathMatcherStack(XPathMatcherStack *this,MemoryManager *manager)

{
  ValueStackOf<int> *pVVar1;
  RefVectorOf<xercesc_4_0::XPathMatcher> *this_00;
  CleanupType_conflict27 cleanup;
  
  this->fMatchersCount = 0;
  this->fContextStack = (ValueStackOf<int> *)0x0;
  this->fMatchers = (RefVectorOf<xercesc_4_0::XPathMatcher> *)0x0;
  cleanup.fToCall = (MFPT)cleanUp;
  cleanup._16_8_ = 0;
  cleanup.fObject = this;
  pVVar1 = (ValueStackOf<int> *)XMemory::operator_new(0x30,manager);
  ValueVectorOf<int>::ValueVectorOf(&pVVar1->fVector,8,manager,false);
  this->fContextStack = pVVar1;
  this_00 = (RefVectorOf<xercesc_4_0::XPathMatcher> *)XMemory::operator_new(0x30,manager);
  RefVectorOf<xercesc_4_0::XPathMatcher>::RefVectorOf(this_00,8,true,manager);
  this->fMatchers = this_00;
  cleanup.fObject = (XPathMatcherStack *)0x0;
  JanitorMemFunCall<xercesc_4_0::XPathMatcherStack>::~JanitorMemFunCall(&cleanup);
  return;
}

Assistant:

XPathMatcherStack::XPathMatcherStack(MemoryManager* const manager)
    : fMatchersCount(0)
    , fContextStack(0)
    , fMatchers(0)
{
    CleanupType cleanup(this, &XPathMatcherStack::cleanUp);

    try {
        fContextStack = new (manager) ValueStackOf<int>(8, manager);
        fMatchers = new (manager) RefVectorOf<XPathMatcher>(8, true, manager);
    }
    catch(const OutOfMemoryException&)
    {
        cleanup.release();

        throw;
    }

    cleanup.release();
}